

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

bool __thiscall BigInt::operator==(BigInt *this,BigInt *b)

{
  int iVar1;
  bool bVar2;
  string local_48;
  string local_28;
  
  to_string_abi_cxx11_(&local_48,this);
  to_string_abi_cxx11_(&local_28,b);
  if (local_48._M_string_length == local_28._M_string_length) {
    if (local_48._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_48._M_dataplus._M_p,local_28._M_dataplus._M_p,local_48._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool BigInt::operator==(BigInt& b) {
    return (this->to_string() == b.to_string());
}